

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O2

void __thiscall agg::gsv_text::rewind(gsv_text *this,FILE *__stream)

{
  int8u iVar1;
  int8u iVar2;
  int8u iVar3;
  int8u iVar4;
  int8u *piVar5;
  ulong uVar6;
  double dVar7;
  
  this->m_status = initial;
  piVar5 = (int8u *)this->m_font;
  if (piVar5 != (int8u *)0x0) {
    this->m_indices = piVar5;
    uVar6 = (ulong)this->m_big_endian;
    iVar1 = piVar5[uVar6 + 4];
    iVar2 = piVar5[uVar6];
    iVar3 = piVar5[uVar6 ^ 5];
    iVar4 = piVar5[this->m_big_endian ^ 1];
    this->m_indices = piVar5 + CONCAT11(iVar4,iVar2);
    this->m_glyphs = (int8 *)(piVar5 + (ulong)CONCAT11(iVar4,iVar2) + 0x202);
    dVar7 = this->m_height / (double)CONCAT11(iVar3,iVar1);
    this->m_h = dVar7;
    uVar6 = -(ulong)(this->m_width == 0.0);
    this->m_w = (double)(~uVar6 & (ulong)(this->m_width / (double)CONCAT11(iVar3,iVar1)) |
                        uVar6 & (ulong)dVar7);
    if (this->m_flip == true) {
      this->m_h = -dVar7;
    }
    this->m_cur_chr = this->m_text;
  }
  return;
}

Assistant:

void gsv_text::rewind(unsigned)
    {
        m_status = initial;
        if(m_font == 0) return;
        
        m_indices = (int8u*)m_font;
        double base_height = value(m_indices + 4);
        m_indices += value(m_indices);
        m_glyphs = (int8*)(m_indices + 257*2);
        m_h = m_height / base_height;
        m_w = (m_width == 0.0) ? m_h : m_width / base_height;
        if(m_flip) m_h = -m_h;
        m_cur_chr = m_text;
    }